

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.hpp
# Opt level: O3

void __thiscall
crsGA::
GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
::addFittestOffspring
          (GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
           *this)

{
  pointer pCVar1;
  unsigned_long uVar2;
  Chromosome<Gen,_ComputeFitness> *c;
  Gen *g;
  pointer pGVar3;
  pointer pCVar4;
  pointer pCVar5;
  ulong uVar6;
  pointer pCVar7;
  float fVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> leastFittestIndicesList;
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  localFittestChromosomes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  local_40;
  
  pCVar1 = (this->_fittestChromosomes).
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar4 = (this->_fittestChromosomes).
                super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar4 != pCVar1; pCVar4 = pCVar4 + 1) {
    fVar8 = 0.0;
    for (pGVar3 = (pCVar4->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pGVar3 != (pCVar4->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
                  super__Vector_impl_data._M_finish; pGVar3 = pGVar3 + 1) {
      fVar8 = fVar8 + (float)pGVar3->bit;
    }
    pCVar4->_fitness = -fVar8;
  }
  DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
  ::findLeastFittestIndices
            (&local_58,
             (DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>
              *)this,&this->_population);
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::vector(&local_40,&this->_fittestChromosomes);
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      pCVar1 = local_40.
               super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar4 = local_40.
               super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
      pCVar5 = local_40.
               super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar7 = local_40.
               super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pCVar4 != local_40.
                    super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish &&
          local_40.
          super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_40.
          super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pCVar7 = pCVar4;
          if (pCVar5->_fitness < pCVar4->_fitness || pCVar5->_fitness == pCVar4->_fitness) {
            pCVar7 = pCVar5;
          }
          pCVar4 = pCVar4 + 1;
          pCVar5 = pCVar7;
        } while (pCVar4 != local_40.
                           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      uVar2 = local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      pCVar4 = (this->_population)._chromosomes.
               super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar4[uVar2]._fitness = pCVar7->_fitness;
      std::vector<Gen,_std::allocator<Gen>_>::operator=(&pCVar4[uVar2]._genes,&pCVar7->_genes);
      std::
      vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
      ::_M_erase(&local_40,
                 (Chromosome<Gen,_ComputeFitness> *)
                 (((long)pCVar7 - (long)pCVar1) +
                 (long)local_40.
                       super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
                       ._M_impl.super__Vector_impl_data._M_start));
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar6 < (ulong)((long)local_58.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_58.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::~vector(&local_40);
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void addFittestOffspring()
    {
        //Update fitness values of offspring
        for (auto &c : _fittestChromosomes)
        {
            c.calculateFitness(_data.get());
        }

        //Get index of least fit individual
        auto leastFittestIndicesList = ReplacementPolicy::findLeastFittestIndices(_population);

        //Replace least fittest individual from most fittest offspring
        auto localFittestChromosomes = _fittestChromosomes;
        for (auto i = 0u; i < leastFittestIndicesList.size(); i++)
        {
            auto fittestChromosomeIndex = findFittestOffspringIndex(localFittestChromosomes);
            _population.setChromosome(leastFittestIndicesList[i], localFittestChromosomes[fittestChromosomeIndex]);
            localFittestChromosomes.erase(localFittestChromosomes.begin() + fittestChromosomeIndex);
        }
    }